

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cc
# Opt level: O1

double __thiscall fasttext::Meter::log(Meter *this,double __x)

{
  uint64_t *puVar1;
  ulong uVar2;
  key_type *pkVar3;
  undefined1 auVar4 [16];
  mapped_type *pmVar5;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var6;
  ulong *in_RDX;
  const_iterator __end1;
  ulong *in_RSI;
  const_iterator __begin1;
  ulong uVar7;
  int *label;
  key_type *pkVar8;
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  this->nexamples_ = this->nexamples_ + 1;
  uVar7 = *in_RDX;
  uVar2 = in_RDX[1];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = in_RSI[1];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar2;
  auVar4 = vpunpcklqdq_avx(auVar9,auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *in_RSI;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar7;
  auVar9 = vpunpcklqdq_avx(auVar13,auVar14);
  auVar4 = vpsubq_avx(auVar4,auVar9);
  auVar9 = vpsravq_avx512vl(auVar4,_DAT_00134b80);
  auVar4._0_8_ = (this->metrics_).gold;
  auVar4._8_8_ = (this->metrics_).predicted;
  auVar4 = vpaddq_avx(auVar9,auVar4);
  auVar11 = ZEXT1664(auVar4);
  (this->metrics_).gold = auVar4._0_8_;
  (this->metrics_).predicted = auVar4._8_8_;
  if (uVar7 != uVar2) {
    do {
      pkVar8 = (key_type *)(uVar7 + 4);
      pmVar5 = std::__detail::
               _Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->labelMetrics_,pkVar8);
      pmVar5->predicted = pmVar5->predicted + 1;
      _Var6 = std::
              __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                        (*in_RSI,in_RSI[1],pkVar8);
      if (_Var6._M_current != (int *)in_RSI[1]) {
        pmVar5 = std::__detail::
                 _Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->labelMetrics_,pkVar8);
        pmVar5->predictedGold = pmVar5->predictedGold + 1;
        puVar1 = &(this->metrics_).predictedGold;
        *puVar1 = *puVar1 + 1;
      }
      uVar7 = uVar7 + 8;
    } while (uVar7 != uVar2);
  }
  dVar10 = auVar11._0_8_;
  pkVar8 = (key_type *)*in_RSI;
  pkVar3 = (key_type *)in_RSI[1];
  if (pkVar8 != pkVar3) {
    do {
      pmVar5 = std::__detail::
               _Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->labelMetrics_,pkVar8);
      dVar10 = auVar11._0_8_;
      pmVar5->gold = pmVar5->gold + 1;
      pkVar8 = pkVar8 + 1;
    } while (pkVar8 != pkVar3);
  }
  return dVar10;
}

Assistant:

void Meter::log(
    const std::vector<int32_t>& labels,
    const Predictions& predictions) {
  nexamples_++;
  metrics_.gold += labels.size();
  metrics_.predicted += predictions.size();

  for (const auto& prediction : predictions) {
    labelMetrics_[prediction.second].predicted++;

    if (utils::contains(labels, prediction.second)) {
      labelMetrics_[prediction.second].predictedGold++;
      metrics_.predictedGold++;
    }
  }

  for (const auto& label : labels) {
    labelMetrics_[label].gold++;
  }
}